

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O3

void __thiscall yactfr::internal::TsdlParser::_parseMetadata(TsdlParser *this)

{
  char *pcVar1;
  string msg;
  string msg_00;
  TextLocation loc;
  TextLocation loc_00;
  bool bVar2;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  Index in_stack_ffffffffffffff88;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  TextLocation local_30;
  
  _stackPush(this,Root);
  do {
    bVar2 = _tryParseRootBlock(this);
  } while (bVar2);
  do {
    StrScanner::skipCommentsAndWhitespaces<true,true>(&this->_ss);
    bVar2 = StrScanner::tryScanToken<true,true>(&this->_ss,";");
  } while (bVar2);
  if ((this->_ss)._at != (this->_ss)._end) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,
               "Expecting data type alias (`typealias`, `typedef`, `enum NAME`, `struct NAME`, or `variant NAME`), trace type block (`trace`), trace environment block (`env`), clock type block (`clock`), data stream type block (`stream`), or event record type block (`event`). Did you forget the `;` after the closing `}` of the block?"
               ,"");
    pcVar1 = (this->_ss)._at;
    TextLocation::TextLocation
              (&local_30,(long)pcVar1 - (long)(this->_ss)._begin,(this->_ss)._nbLines,
               (long)pcVar1 - (long)(this->_ss)._lineBegin);
    msg._M_string_length = local_30._lineNumber;
    msg._M_dataplus._M_p = (pointer)local_30._offset;
    msg.field_2._M_allocated_capacity = local_30._colNumber;
    msg.field_2._8_8_ = in_stack_ffffffffffffff70;
    loc._lineNumber = in_stack_ffffffffffffff80;
    loc._offset = in_stack_ffffffffffffff78;
    loc._colNumber = in_stack_ffffffffffffff88;
    throwTextParseError(msg,loc);
  }
  if ((this->_pseudoTraceType).super_type.m_initialized == false) {
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Missing `trace` block.","");
    msg_00.field_2._M_allocated_capacity = 0;
    msg_00._M_dataplus._M_p = (pointer)0x0;
    msg_00._M_string_length = 0;
    msg_00.field_2._8_8_ = in_stack_ffffffffffffff70;
    loc_00._colNumber = 0;
    loc_00._offset = 0;
    loc_00._lineNumber = 0;
    throwTextParseError(msg_00,loc_00);
  }
  _createTraceType(this);
  _stackPop(this);
  return;
}

Assistant:

void TsdlParser::_parseMetadata()
{
    _LexicalScope lexScope {*this, _tStackFrame::Kind::Root};

    while (this->_tryParseRootBlock());

    // make sure we skip the remaining fruitless stuff
    this->_skipCommentsAndWhitespacesAndSemicolons();

    if (!_ss.isDone()) {
        throwTextParseError("Expecting data type alias (`typealias`, `typedef`, `enum NAME`, "
                            "`struct NAME`, or `variant NAME`), trace type block (`trace`), "
                            "trace environment block (`env`), "
                            "clock type block (`clock`), data stream type block (`stream`), "
                            "or event record type block (`event`). Did you forget the `;` "
                            "after the closing `}` of the block?",
                            _ss.loc());
    }

    if (!_pseudoTraceType) {
        throwTextParseError("Missing `trace` block.");
    }

    // create a yactfr trace type from the pseudo trace type
    this->_createTraceType();
}